

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompression.cpp
# Opt level: O2

void __thiscall
duckdb::CompressedStringScanState::ScanToFlatVector
          (CompressedStringScanState *this,Vector *result,idx_t result_offset,idx_t start,
          idx_t scan_count)

{
  buffer_ptr<SelectionVector> *this_00;
  byte bVar1;
  data_ptr_t pdVar2;
  uint32_t *puVar3;
  unsigned_long count;
  SelectionVector *pSVar4;
  ulong uVar5;
  uint16_t string_len;
  data_ptr_t pdVar6;
  ulong uVar7;
  bool bVar8;
  string_t sVar9;
  idx_t decompress_count;
  shared_ptr<duckdb::SelectionVector,_true> local_40;
  
  pdVar6 = result->data;
  uVar7 = (ulong)((uint)start & 0x1f);
  count = BitpackingPrimitives::RoundUpToAlgorithmGroupSize<unsigned_long>(scan_count + uVar7);
  this_00 = &this->sel_vec;
  if (((this->sel_vec).internal.
       super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) || (this->sel_vec_size < count)) {
    this->sel_vec_size = count;
    make_shared_ptr<duckdb::SelectionVector,unsigned_long&>((unsigned_long *)&local_40);
    shared_ptr<duckdb::SelectionVector,_true>::operator=(this_00,&local_40);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.internal.
                super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  bVar1 = this->current_width;
  pdVar2 = this->base_data;
  pSVar4 = shared_ptr<duckdb::SelectionVector,_true>::operator->(this_00);
  BitpackingPrimitives::UnPackBuffer<unsigned_int>
            ((data_ptr_t)pSVar4->sel_vector,
             pdVar2 + ((ulong)bVar1 * (start & 0xffffffffffffffe0) >> 3),count,this->current_width,
             false);
  pdVar6 = pdVar6 + result_offset * 0x10 + 8;
  while (bVar8 = scan_count != 0, scan_count = scan_count - 1, bVar8) {
    pSVar4 = shared_ptr<duckdb::SelectionVector,_true>::operator->(this_00);
    uVar5 = uVar7;
    if (pSVar4->sel_vector != (sel_t *)0x0) {
      uVar5 = (ulong)pSVar4->sel_vector[uVar7];
    }
    puVar3 = this->index_buffer_ptr;
    if ((uVar5 & 0xffffffff) == 0) {
      string_len = 0;
    }
    else {
      string_len = (short)puVar3[uVar5 & 0xffffffff] - (short)puVar3[(int)uVar5 - 1];
    }
    sVar9 = FetchStringFromDict(this,puVar3[uVar5],string_len);
    *(long *)(pdVar6 + -8) = sVar9.value._0_8_;
    *(long *)pdVar6 = sVar9.value._8_8_;
    pdVar6 = pdVar6 + 0x10;
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void CompressedStringScanState::ScanToFlatVector(Vector &result, idx_t result_offset, idx_t start, idx_t scan_count) {
	auto result_data = FlatVector::GetData<string_t>(result);

	// Handling non-bitpacking-group-aligned start values;
	idx_t start_offset = start % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

	// We will scan in blocks of BITPACKING_ALGORITHM_GROUP_SIZE, so we may scan some extra values.
	idx_t decompress_count = BitpackingPrimitives::RoundUpToAlgorithmGroupSize(scan_count + start_offset);

	// Create a decompression buffer of sufficient size if we don't already have one.
	if (!sel_vec || sel_vec_size < decompress_count) {
		sel_vec_size = decompress_count;
		sel_vec = make_buffer<SelectionVector>(decompress_count);
	}

	data_ptr_t src = &base_data[((start - start_offset) * current_width) / 8];
	sel_t *sel_vec_ptr = sel_vec->data();

	BitpackingPrimitives::UnPackBuffer<sel_t>(data_ptr_cast(sel_vec_ptr), src, decompress_count, current_width);

	for (idx_t i = 0; i < scan_count; i++) {
		// Lookup dict offset in index buffer
		auto string_number = sel_vec->get_index(i + start_offset);
		auto dict_offset = index_buffer_ptr[string_number];
		auto str_len = GetStringLength(UnsafeNumericCast<sel_t>(string_number));
		result_data[result_offset + i] = FetchStringFromDict(UnsafeNumericCast<int32_t>(dict_offset), str_len);
	}
}